

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::Build(cmake *this,string *dir,string *target,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,bool clean)

{
  cmState *pcVar1;
  string *target_00;
  string *bindir;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  cmGlobalGenerator *pcVar6;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  char *local_220;
  char *cachedVerbose;
  undefined1 local_210 [6];
  bool verbose;
  char *local_1f0;
  char *cachedProjectName;
  string projName;
  string output;
  string local_1a0;
  auto_ptr<cmGlobalGenerator> local_180;
  auto_ptr<cmGlobalGenerator> gen;
  string local_170;
  char *local_150;
  char *cachedGenerator;
  string local_140;
  undefined1 local_120 [8];
  string cachePathFound;
  string cmakeFiles;
  string cacheFile;
  string cachePath;
  string local_98;
  allocator local_61;
  string local_60;
  byte local_39;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_38;
  bool clean_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *nativeOptions_local;
  string *config_local;
  string *target_local;
  string *dir_local;
  cmake *this_local;
  
  local_39 = clean;
  pvStack_38 = nativeOptions;
  nativeOptions_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)config;
  config_local = target;
  target_local = dir;
  dir_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"",&local_61);
  SetHomeDirectory(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"",(allocator *)(cachePath.field_2._M_local_buf + 0xf));
  SetHomeOutputDirectory(this,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(cachePath.field_2._M_local_buf + 0xf));
  bVar2 = cmsys::SystemTools::FileIsDirectory(target_local);
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)(cacheFile.field_2._M_local_buf + 8),(string *)target_local);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)(cacheFile.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)(cmakeFiles.field_2._M_local_buf + 8),
               (string *)(cacheFile.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=
              ((string *)(cmakeFiles.field_2._M_local_buf + 8),"/CMakeCache.txt");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar4);
    if (!bVar2) {
      std::__cxx11::string::string
                ((string *)(cachePathFound.field_2._M_local_buf + 8),
                 (string *)(cacheFile.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=
                ((string *)(cachePathFound.field_2._M_local_buf + 8),"/CMakeFiles");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::FileExists(pcVar4);
      if (bVar2) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
                  ((string *)local_120,(cmSystemTools *)0x995277,pcVar4,"/",(char *)nativeOptions);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          cmsys::SystemTools::GetFilenamePath(&local_140,(string *)local_120);
          std::__cxx11::string::operator=
                    ((string *)(cacheFile.field_2._M_local_buf + 8),(string *)&local_140);
          std::__cxx11::string::~string((string *)&local_140);
        }
        std::__cxx11::string::~string((string *)local_120);
      }
      std::__cxx11::string::~string((string *)(cachePathFound.field_2._M_local_buf + 8));
    }
    bVar2 = LoadCache(this,(string *)((long)&cacheFile.field_2 + 8));
    if (bVar2) {
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_170,"CMAKE_GENERATOR",(allocator *)((long)&gen.x_ + 7));
      pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gen.x_ + 7));
      local_150 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
        this_local._4_4_ = 1;
        cachedGenerator._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1a0,pcVar4,(allocator *)(output.field_2._M_local_buf + 0xf));
        pcVar6 = CreateGlobalGenerator(this,&local_1a0);
        cmsys::auto_ptr<cmGlobalGenerator>::auto_ptr(&local_180,pcVar6);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
        pcVar6 = cmsys::auto_ptr<cmGlobalGenerator>::get(&local_180);
        if (pcVar6 == (cmGlobalGenerator *)0x0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"");
          poVar3 = std::operator<<(poVar3,local_150);
          std::operator<<(poVar3,"\"\n");
          this_local._4_4_ = 1;
          cachedGenerator._4_4_ = 1;
        }
        else {
          std::__cxx11::string::string((string *)(projName.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&cachedProjectName);
          pcVar1 = this->State;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_210,"CMAKE_PROJECT_NAME",
                     (allocator *)((long)&cachedVerbose + 7));
          pcVar4 = cmState::GetCacheEntryValue(pcVar1,(string *)local_210);
          std::__cxx11::string::~string((string *)local_210);
          std::allocator<char>::~allocator((allocator<char> *)((long)&cachedVerbose + 7));
          local_1f0 = pcVar4;
          if (pcVar4 == (char *)0x0) {
            std::operator<<((ostream *)&std::cerr,
                            "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
            this_local._4_4_ = 1;
          }
          else {
            std::__cxx11::string::operator=((string *)&cachedProjectName,pcVar4);
            cachedVerbose._6_1_ = 0;
            pcVar1 = this->State;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_240,"CMAKE_VERBOSE_MAKEFILE",&local_241);
            pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_240);
            std::__cxx11::string::~string((string *)&local_240);
            std::allocator<char>::~allocator((allocator<char> *)&local_241);
            local_220 = pcVar4;
            if (pcVar4 != (char *)0x0) {
              cachedVerbose._6_1_ = cmSystemTools::IsOn(pcVar4);
            }
            pcVar6 = cmsys::auto_ptr<cmGlobalGenerator>::operator->(&local_180);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_268,"",&local_269);
            bindir = target_local;
            target_00 = config_local;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_290,"",&local_291);
            this_local._4_4_ =
                 cmGlobalGenerator::Build
                           (pcVar6,&local_268,bindir,(string *)&cachedProjectName,target_00,
                            (string *)((long)&projName.field_2 + 8),&local_290,
                            (string *)nativeOptions_local,(bool)(local_39 & 1),false,
                            (bool)(cachedVerbose._6_1_ & 1),0.0,OUTPUT_PASSTHROUGH,pvStack_38);
            std::__cxx11::string::~string((string *)&local_290);
            std::allocator<char>::~allocator((allocator<char> *)&local_291);
            std::__cxx11::string::~string((string *)&local_268);
            std::allocator<char>::~allocator((allocator<char> *)&local_269);
          }
          cachedGenerator._4_4_ = 1;
          std::__cxx11::string::~string((string *)&cachedProjectName);
          std::__cxx11::string::~string((string *)(projName.field_2._M_local_buf + 8));
        }
        cmsys::auto_ptr<cmGlobalGenerator>::~auto_ptr(&local_180);
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
      this_local._4_4_ = 1;
      cachedGenerator._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)(cmakeFiles.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(cacheFile.field_2._M_local_buf + 8));
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar3 = std::operator<<(poVar3,(string *)target_local);
    std::operator<<(poVar3," is not a directory\n");
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int cmake::Build(const std::string& dir,
                 const std::string& target,
                 const std::string& config,
                 const std::vector<std::string>& nativeOptions,
                 bool clean)
{

  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if(!cmSystemTools::FileIsDirectory(dir))
    {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
    }
  std::string cachePath = dir;
  cmSystemTools::ConvertToUnixSlashes(cachePath);
  std::string cacheFile = cachePath;
  cacheFile += "/CMakeCache.txt";
  if(!cmSystemTools::FileExists(cacheFile.c_str()))
    {
    // search in parent directories for cache
    std::string cmakeFiles = cachePath;
    cmakeFiles += "/CMakeFiles";
    if(cmSystemTools::FileExists(cmakeFiles.c_str()))
      {
      std::string cachePathFound =
        cmSystemTools::FileExistsInParentDirectories(
          "CMakeCache.txt", cachePath.c_str(), "/");
      if(!cachePathFound.empty())
        {
        cachePath = cmSystemTools::GetFilenamePath(cachePathFound);
        }
      }
    }

  if(!this->LoadCache(cachePath))
    {
    std::cerr << "Error: could not load cache\n";
    return 1;
    }
  const char* cachedGenerator =
      this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if(!cachedGenerator)
    {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
    }
  cmsys::auto_ptr<cmGlobalGenerator> gen(
    this->CreateGlobalGenerator(cachedGenerator));
  if(!gen.get())
    {
    std::cerr << "Error: could create CMAKE_GENERATOR \""
              << cachedGenerator << "\"\n";
    return 1;
    }
  std::string output;
  std::string projName;
  const char* cachedProjectName =
      this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if(!cachedProjectName)
    {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
    }
  projName = cachedProjectName;
  bool verbose = false;
  const char* cachedVerbose =
      this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE");
  if(cachedVerbose)
    {
    verbose = cmSystemTools::IsOn(cachedVerbose);
    }
  return gen->Build("", dir,
                    projName, target,
                    output,
                    "",
                    config, clean, false, verbose, 0,
                    cmSystemTools::OUTPUT_PASSTHROUGH,
                    nativeOptions);
}